

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

pair<int,_int> __thiscall
ChainstateManager::GetPruneRange
          (ChainstateManager *this,Chainstate *chainstate,int last_height_can_prune)

{
  Chainstate *pCVar1;
  uint uVar2;
  int iVar3;
  CBlockIndex *pCVar4;
  pair<int,_int> pVar5;
  optional<int> *poVar6;
  ulong uVar7;
  int iVar8;
  long in_FS_OFFSET;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)((ulong)((long)(chainstate->m_chain).vChain.
                          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(chainstate->m_chain).vChain.
                         super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3) < 2) {
    pVar5.first = 0;
    pVar5.second = 0;
    goto LAB_00b08bcf;
  }
  GetAll(&local_40,this);
  if ((ulong)((long)local_40.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl
                    .super__Vector_impl_data._M_finish -
             (long)local_40.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                   super__Vector_impl_data._M_start) < 9) {
    if (local_40.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_40.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_40.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
LAB_00b08ba2:
    uVar7 = 0;
  }
  else {
    pCVar1 = (this->m_snapshot_chainstate)._M_t.
             super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
             super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
             super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
    if (local_40.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_40.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_40.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (pCVar1 != chainstate) goto LAB_00b08ba2;
    if (this->m_active_chainstate == (Chainstate *)0x0) {
      pCVar4 = (CBlockIndex *)0x0;
    }
    else {
      pCVar4 = Chainstate::SnapshotBase(this->m_active_chainstate);
    }
    if (pCVar4 == (CBlockIndex *)0x0) {
      local_40.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
    }
    else {
      local_40.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)((ulong)(uint)pCVar4->nHeight | 0x100000000);
    }
    poVar6 = inline_assertion_check<true,std::optional<int>>
                       ((optional<int> *)&local_40,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x195f,"GetPruneRange","GetSnapshotBaseHeight()");
    uVar7 = (ulong)((poVar6->super__Optional_base<int,_true,_true>)._M_payload.
                    super__Optional_payload_base<int>._M_payload._M_value + 1);
  }
  iVar8 = (int)((ulong)((long)(chainstate->m_chain).vChain.
                              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(chainstate->m_chain).vChain.
                             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3);
  iVar3 = 0x121;
  if (0x121 < iVar8) {
    iVar3 = iVar8;
  }
  uVar2 = iVar3 - 0x121U;
  if (last_height_can_prune <= (int)(iVar3 - 0x121U)) {
    uVar2 = last_height_can_prune;
  }
  pVar5 = (pair<int,_int>)((ulong)uVar2 << 0x20 | uVar7);
LAB_00b08bcf:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pVar5;
  }
  __stack_chk_fail();
}

Assistant:

std::pair<int, int> ChainstateManager::GetPruneRange(const Chainstate& chainstate, int last_height_can_prune)
{
    if (chainstate.m_chain.Height() <= 0) {
        return {0, 0};
    }
    int prune_start{0};

    if (this->GetAll().size() > 1 && m_snapshot_chainstate.get() == &chainstate) {
        // Leave the blocks in the background IBD chain alone if we're pruning
        // the snapshot chain.
        prune_start = *Assert(GetSnapshotBaseHeight()) + 1;
    }

    int max_prune = std::max<int>(
        0, chainstate.m_chain.Height() - static_cast<int>(MIN_BLOCKS_TO_KEEP));

    // last block to prune is the lesser of (caller-specified height, MIN_BLOCKS_TO_KEEP from the tip)
    //
    // While you might be tempted to prune the background chainstate more
    // aggressively (i.e. fewer MIN_BLOCKS_TO_KEEP), this won't work with index
    // building - specifically blockfilterindex requires undo data, and if
    // we don't maintain this trailing window, we hit indexing failures.
    int prune_end = std::min(last_height_can_prune, max_prune);

    return {prune_start, prune_end};
}